

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
* phmap::priv::
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  ::init_internal(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                  *n,btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                     *parent)

{
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  **m;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  *parent_local;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  *n_local;
  
  init_leaf(n,parent,0xf);
  set_max_count(n,'\0');
  m = mutable_child(n,0);
  SanitizerPoisonMemoryRegion(m,0x80);
  return n;
}

Assistant:

static btree_node *init_internal(btree_node *n, btree_node *parent) {
            init_leaf(n, parent, kNodeValues);
            // Set `max_count` to a sentinel value to indicate that this node is
            // internal.
            n->set_max_count(kInternalNodeMaxCount);
            phmap::priv::SanitizerPoisonMemoryRegion(
                &n->mutable_child(0), (kNodeValues + 1) * sizeof(btree_node *));
            return n;
        }